

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall
SuffixTree::GeneralizedSuffixTree::~GeneralizedSuffixTree(GeneralizedSuffixTree *this)

{
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  GeneralizedSuffixTree *this_local;
  
  printf("Clearing tree...\n");
  if ((this->nodes != (char *)0x0) && (this->leaves != (char *)0x0)) {
    for (local_14 = 0; local_14 < this->nodes_num; local_14 = local_14 + 1) {
      Node::~Node((Node *)(this->nodes + (ulong)local_14 * 0x60));
    }
    for (local_18 = 0; local_18 < this->leaves_num; local_18 = local_18 + 1) {
    }
    free(this->nodes);
    free(this->leaves);
  }
  printf("Tree was cleared successfully\n");
  std::
  vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
  ::~vector(&this->answers);
  std::vector<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>::~vector
            (&this->previous_suffixes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->strings);
  return;
}

Assistant:

GeneralizedSuffixTree::~GeneralizedSuffixTree()
{
    printf ("Clearing tree...\n");
    if (nodes && leaves)
    {
        for (uint i = 0; i < nodes_num; ++i)
            reinterpret_cast<Node *> (nodes + i * sizeof (Node))->~Node();
        for (uint i = 0; i < leaves_num; ++i)
            reinterpret_cast<Leaf *> (leaves + i * sizeof (Leaf))->~Leaf();
        free (nodes);
        free (leaves);
    }
    printf ("Tree was cleared successfully\n");
}